

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int luaB_ipairs(lua_State *L)

{
  StkId pTVar1;
  
  luaL_checktype(L,1,5);
  lua_pushvalue(L,-0x2713);
  lua_pushvalue(L,1);
  pTVar1 = L->top;
  (pTVar1->value).gc = (GCObject *)0x0;
  pTVar1->tt = 3;
  L->top = L->top + 1;
  return 3;
}

Assistant:

static int luaB_ipairs(lua_State*L){
luaL_checktype(L,1,5);
lua_pushvalue(L,lua_upvalueindex(1));
lua_pushvalue(L,1);
lua_pushinteger(L,0);
return 3;
}